

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O0

void __thiscall prevector_tests::prevector_tester<8U,_int>::move(prevector_tester<8U,_int> *this)

{
  long lVar1;
  prevector<8U,_int,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  prevector<8U,_int,_unsigned_int,_int> *this_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (prevector<8U,_int,_unsigned_int,_int> *)((long)&in_RDI->_union + 0x18);
  std::vector<int,_std::allocator<int>_>::operator=
            (in_stack_ffffffffffffffe8,(vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)this_00);
  prevector<8U,_int,_unsigned_int,_int>::operator=
            ((prevector<8U,_int,_unsigned_int,_int> *)((long)&in_RDI[2]._union + 8),in_RDI);
  prevector<8U,_int,_unsigned_int,_int>::clear(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void move() {
        real_vector = std::move(real_vector_alt);
        real_vector_alt.clear();
        pre_vector = std::move(pre_vector_alt);
        pre_vector_alt.clear();
    }